

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_> __thiscall
cppqc::tupleOf<std::vector<int,std::allocator<int>>>
          (cppqc *this,Generator<std::vector<int,_std::allocator<int>_>_> *g)

{
  undefined4 extraout_var;
  TupleGenerator<std::vector<int,_std::allocator<int>_>_> local_10;
  
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>.
  _M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*((g->m_gen)._M_t.
          super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
          .
          super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
         ._M_head_impl)->_vptr_GenConcept[4])();
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>.
  _M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  Generator<std::tuple<std::vector<int,std::allocator<int>>>>::
  Generator<cppqc::detail::TupleGenerator<std::vector<int,std::allocator<int>>>>
            ((Generator<std::tuple<std::vector<int,std::allocator<int>>>> *)this,&local_10);
  if ((_Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>)
      local_10.m_gen.
      super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>.
      super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>.
      _M_head_impl.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
      .
      super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
      ._M_head_impl != (Generator<std::vector<int,_std::allocator<int>_>_>)0x0) {
    (**(code **)(*(long *)local_10.m_gen.
                          super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>
                          .
                          super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>
                          ._M_head_impl.m_gen._M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                          .
                          super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
            )this;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}